

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O2

int AF_A_ItBurnsItBurns(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *ppVar2;
  bool bVar3;
  int in_EAX;
  int iVar4;
  FState *state;
  APlayerPawn *ent;
  char *__assertion;
  FName FStack_28;
  FSoundID local_24;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055376f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (APlayerPawn *)(param->field_0).field_1.a;
    FStack_28.Index = in_EAX;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (APlayerPawn *)0x0) {
LAB_00553646:
        ent = (APlayerPawn *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0055376f;
        }
      }
      if (numparam == 1) goto LAB_005536c6;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0055375f;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0055376f;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0055375f;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005536c6:
        iVar4 = S_FindSound("human/imonfire");
        _FStack_28 = CONCAT44(iVar4,FStack_28.Index);
        S_Sound(&ent->super_AActor,2,&local_24,1.0,1.0);
        ppVar2 = (ent->super_AActor).player;
        if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo == ent)) {
          FName::FName(&FStack_28,"FireHands");
          state = AActor::FindState(&ent->super_AActor,&FStack_28);
          P_SetPsprite(ppVar2,PSP_STRIFEHANDS,state,false);
          ppVar2 = (ent->super_AActor).player;
          ppVar2->ReadyWeapon = (AWeapon *)0x0;
          ppVar2->PendingWeapon = (AWeapon *)0xffffffffffffffff;
          ppVar2->playerstate = '\0';
          ppVar2->extralight = 3;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0055376f;
    }
    if (ent == (APlayerPawn *)0x0) goto LAB_00553646;
  }
LAB_0055375f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0055376f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x15d,"int AF_A_ItBurnsItBurns(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ItBurnsItBurns)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_VOICE, "human/imonfire", 1, ATTN_NORM);

	if (self->player != nullptr && self->player->mo == self)
	{
		P_SetPsprite(self->player, PSP_STRIFEHANDS, self->FindState("FireHands"));

		self->player->ReadyWeapon = nullptr;
		self->player->PendingWeapon = WP_NOCHANGE;
		self->player->playerstate = PST_LIVE;
		self->player->extralight = 3;
	}
	return 0;
}